

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::
ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::VarHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *this,int info)

{
  StringRef name_00;
  uint in_ESI;
  VarHandler *in_RDI;
  StringRef SVar1;
  IntSuffixHandler suffix_handler_1;
  DblSuffixHandler suffix_handler;
  Kind kind;
  StringRef name;
  int num_values;
  int num_items;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff98;
  Kind in_stack_ffffffffffffff9c;
  TextReader<fmt::Locale> *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  TextReader<fmt::Locale> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *in_stack_ffffffffffffffc0;
  NLHandler<TestNLHandler3,_int> *local_30;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *local_28;
  VarHandler local_18;
  int local_10;
  uint local_c;
  
  local_c = in_ESI;
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::VarHandler::VarHandler
            (in_RDI,in_stack_ffffffffffffff88);
  local_10 = NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::VarHandler::num_items
                       (&local_18);
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadUInt
            ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *)
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  SVar1 = TextReader<fmt::Locale>::ReadName(in_stack_ffffffffffffffa0);
  TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_ffffffffffffffb0);
  local_30 = (NLHandler<TestNLHandler3,_int> *)SVar1.data_;
  local_28 = (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *)SVar1.size_;
  if ((local_c & 4) == 0) {
    SVar1.size_ = (size_t)in_stack_ffffffffffffffb0;
    SVar1.data_ = (char *)local_28;
    NLHandler<TestNLHandler3,_int>::OnIntSuffix
              (local_30,SVar1,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::IntReader,mp::NLHandler<TestNLHandler3,int>::IntSuffixHandler>
              (in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
               (int)in_stack_ffffffffffffffb8,(IntSuffixHandler *)in_stack_ffffffffffffffb0);
  }
  else {
    name_00.data_._4_4_ = in_stack_ffffffffffffffac;
    name_00.data_._0_4_ = in_stack_ffffffffffffffa8;
    name_00.size_ = (size_t)in_stack_ffffffffffffffb0;
    NLHandler<TestNLHandler3,_int>::OnDblSuffix
              ((NLHandler<TestNLHandler3,_int> *)in_stack_ffffffffffffffa0,name_00,
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    ReadSuffixValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::DoubleReader,mp::NLHandler<TestNLHandler3,int>::DblSuffixHandler>
              (local_28,(int)((ulong)local_30 >> 0x20),(int)local_30,
               (DblSuffixHandler *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadSuffix(int info) {
  int num_items = ItemInfo(*this).num_items();
  int num_values = ReadUInt(1, num_items + 1);
  fmt::StringRef name = reader_.ReadName();
  reader_.ReadTillEndOfLine();
  suf::Kind kind = static_cast<suf::Kind>(info & internal::SUFFIX_KIND_MASK);
  if ((info & suf::FLOAT) != 0) {
    typename Handler::DblSuffixHandler
        suffix_handler = handler_.OnDblSuffix(name, kind, num_values);
    ReadSuffixValues<DoubleReader>(num_values, num_items, suffix_handler);
  } else {
    typename Handler::IntSuffixHandler
        suffix_handler = handler_.OnIntSuffix(name, kind, num_values);
    ReadSuffixValues<IntReader>(num_values, num_items, suffix_handler);
  }
}